

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildProfiled2CallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,ProfileId profileId2)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  ValueType valueType;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_01;
  JITTimeProfileInfo *this_02;
  ArrayCallSiteInfo *pAVar5;
  Instr *pIVar6;
  undefined6 in_register_00000032;
  undefined6 in_register_0000008a;
  OpCode newOpcode;
  TypeId typeId;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  undefined4 local_40;
  RegSlot local_3c;
  uint32 local_38;
  OpCode local_32 [4];
  OpCode opcode_local;
  
  local_40 = (undefined4)CONCAT62(in_register_0000008a,argCount);
  local_32[0] = opcode;
  if (((uint)CONCAT62(in_register_00000032,opcode) & 0xfffffffd) != 200) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x19c3,
                       "(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread)"
                       ,
                       "opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread"
                      );
    if (!bVar2) goto LAB_004dbb76;
    *puVar4 = 0;
  }
  local_3c = function;
  local_38 = offset;
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  newOpcode = local_32[0];
  PVar3 = profileId;
  if (returnValue == 0xffffffff) {
    newOpcode = NewScObject;
    if (local_32[0] == NewScObjArraySpread) {
      newOpcode = NewScObjectSpread;
    }
    typeId = TypeIds_Array;
  }
  else {
    bVar2 = Func::HasArrayInfo(this->m_func);
    if (bVar2) {
      this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      this_02 = JITTimeFunctionBody::GetReadOnlyProfileInfo(this_01);
      pAVar5 = JITTimeProfileInfo::GetArrayCallSiteInfo(this_02,profileId2);
    }
    else {
      pAVar5 = (ArrayCallSiteInfo *)0x0;
    }
    if ((pAVar5 == (ArrayCallSiteInfo *)0x0) ||
       (bVar2 = Func::IsJitInDebugMode(this->m_func), bVar2)) {
      newOpcode = NewScObject;
      if (local_32[0] == NewScObjArraySpread) {
        newOpcode = NewScObjectSpread;
      }
      typeId = TypeIds_Array;
    }
    else {
      PVar3 = profileId2;
      if (((pAVar5->field_0).bits & 1) == 0) {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
        typeId = TypeIds_NativeIntArray;
        if (!bVar2) goto LAB_004db9cc;
      }
      typeId = TypeIds_Array;
      if (((pAVar5->field_0).bits & 2) == 0) {
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase);
        typeId = (uint)!bVar2 + (uint)!bVar2 * 2 + TypeIds_Array;
      }
    }
  }
LAB_004db9cc:
  pIVar6 = BuildCallI_Helper(this,newOpcode,local_38,returnValue,local_3c,(ArgSlot)local_40,PVar3,
                             CallFlags_None,0xffffffff);
  this_00 = pIVar6->m_dst;
  if (this_00 != (Opnd *)0x0) {
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::ToLikely((ValueType *)&local_42.field_0);
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_44.field_0,true);
    valueType = ValueType::SetArrayTypeId((ValueType *)&local_46.field_0,typeId);
    IR::Opnd::SetValueType(this_00,valueType);
  }
  if (pIVar6->m_kind == InstrKindJitProfiling) {
    pIVar6[1].m_noLazyHelperAssert = (bool)(pIVar6[1].m_noLazyHelperAssert | 4);
    if (pIVar6->m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_004dbb76;
      *puVar4 = 0;
    }
    *(ProfileId *)((long)&pIVar6[1]._vptr_Instr + 2) = profileId2;
    if (pIVar6->m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar2) goto LAB_004dbb76;
      *puVar4 = 0;
    }
    if (*(ProfileId *)&pIVar6[1]._vptr_Instr != profileId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x19f5,"(callInstr->AsJitProfilingInstr()->profileId == profileId)",
                         "callInstr->AsJitProfilingInstr()->profileId == profileId");
      if (!bVar2) {
LAB_004dbb76:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiled2CallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::ProfileId profileId2)
{
    Assert(opcode == Js::OpCode::ProfiledNewScObjArray || opcode == Js::OpCode::ProfiledNewScObjArraySpread);
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(opcode);

    Js::OpCode useOpcode = opcode;
    // We either want to provide the array profile id (profileId2) to the native array creation or the call profileid (profileId)
    //     to the call to NewScObject
    Js::ProfileId useProfileId = profileId2;
    Js::TypeId arrayTypeId = Js::TypeIds_Array;
    if (returnValue != Js::Constants::NoRegister)
    {
        Js::ArrayCallSiteInfo *arrayCallSiteInfo = nullptr;
        if (m_func->HasArrayInfo())
        {
            arrayCallSiteInfo = m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId2);
        }
        if (arrayCallSiteInfo && !m_func->IsJitInDebugMode())
        {
            if (arrayCallSiteInfo->IsNativeIntArray())
            {
                arrayTypeId = Js::TypeIds_NativeIntArray;
            }
            else if (arrayCallSiteInfo->IsNativeFloatArray())
            {
                arrayTypeId = Js::TypeIds_NativeFloatArray;
            }
        }
        else
        {
            useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            useProfileId = profileId;
        }
    }
    else
    {
        useOpcode = (opcode == Js::OpCode::NewScObjArraySpread) ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
        useProfileId = profileId;
    }
    IR::Instr * callInstr = BuildCallI_Helper(useOpcode, offset, returnValue, function, argCount, useProfileId);
    if (callInstr->GetDst())
    {
        callInstr->GetDst()->SetValueType(
            ValueType::GetObject(ObjectType::Array).ToLikely().SetHasNoMissingValues(true).SetArrayTypeId(arrayTypeId));
    }
    if (callInstr->IsJitProfilingInstr())
    {
        // If we happened to decide in BuildCallI_Helper that this should be a jit profiling instr, then save the fact that it is
        //    a "new Array(args, ...)" call and also save the array profile id (profileId2)
        callInstr->AsJitProfilingInstr()->isNewArray = true;
        callInstr->AsJitProfilingInstr()->arrayProfileId = profileId2;
        // Double check that this profileId made it to the JitProfilingInstr like we expect it to.
        Assert(callInstr->AsJitProfilingInstr()->profileId == profileId);
    }
}